

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O2

void __thiscall t_program::t_program(t_program *this,string *path)

{
  _Rb_tree_header *p_Var1;
  t_scope *this_00;
  string local_70;
  string local_50;
  
  (this->super_t_doc).doc_._M_dataplus._M_p = (pointer)&(this->super_t_doc).doc_.field_2;
  (this->super_t_doc).doc_._M_string_length = 0;
  (this->super_t_doc).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_t_doc).has_doc_ = false;
  (this->super_t_doc)._vptr_t_doc = (_func_int **)&PTR__t_program_00365a38;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->out_path_,"./",(allocator *)&local_50);
  this->out_path_is_absolute_ = false;
  (this->namespace_)._M_dataplus._M_p = (pointer)&(this->namespace_).field_2;
  (this->namespace_)._M_string_length = 0;
  (this->namespace_).field_2._M_local_buf[0] = '\0';
  (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->include_prefix_)._M_dataplus._M_p = (pointer)&(this->include_prefix_).field_2;
  (this->include_prefix_)._M_string_length = 0;
  (this->include_prefix_).field_2._M_local_buf[0] = '\0';
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->namespaces_)._M_t._M_impl.super__Rb_tree_header;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->typedefs_,0,0xa8);
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cpp_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cpp_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cpp_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::__cxx11::string::string((string *)&local_70,(string *)path);
  program_name(&local_50,&local_70);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (t_scope *)operator_new(0x90);
  memset(this_00,0,0x90);
  t_scope::t_scope(this_00);
  this->scope_ = this_00;
  return;
}

Assistant:

t_program(std::string path) : path_(path), out_path_("./"), out_path_is_absolute_(false), recursive_(false) {
    name_ = program_name(path);
    scope_ = new t_scope();
  }